

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O0

_Bool str_to_float(char *string,float *out)

{
  bool bVar1;
  int *piVar2;
  bool bVar3;
  float fVar4;
  bool local_3d;
  bool local_3a;
  bool local_39;
  _Bool result;
  _Bool valid_endptr;
  _Bool failed;
  _Bool out_of_range;
  float conv_ret_val;
  char *endptr;
  size_t sStack_20;
  _Bool terminating_f;
  size_t len;
  float *out_local;
  char *string_local;
  
  len = (size_t)out;
  out_local = (float *)string;
  sStack_20 = strlen(string);
  local_39 = false;
  if (sStack_20 != 0) {
    local_3a = true;
    if (*(char *)((long)out_local + (sStack_20 - 1)) != 'f') {
      local_3a = *(char *)((long)out_local + (sStack_20 - 1)) == 'F';
    }
    local_39 = local_3a;
  }
  endptr._7_1_ = local_39;
  _result = (float *)0x0;
  piVar2 = __errno_location();
  *piVar2 = 0;
  fVar4 = strtof((char *)out_local,(char **)&result);
  piVar2 = __errno_location();
  bVar3 = true;
  if (((sStack_20 != 0) && (bVar3 = true, *piVar2 != 0x22)) && (bVar3 = true, _result != out_local))
  {
    bVar3 = _result == (float *)0x0;
  }
  local_3d = true;
  if (*(char *)_result != '\0') {
    local_3d = (endptr._7_1_ & 1) != 0 && _result == (float *)((long)out_local + (sStack_20 - 1));
  }
  bVar1 = false;
  if (!bVar3) {
    bVar1 = local_3d;
  }
  if (bVar1) {
    *(float *)len = fVar4;
  }
  else {
    *(undefined4 *)len = 0x7fc00000;
  }
  return bVar1;
}

Assistant:

bool str_to_float(const char *string, float *out) {
    size_t len = strlen(string);

    bool terminating_f =
        len >= 1 && (string[len - 1] == 'f' || string[len - 1] == 'F');

    char *endptr = NULL;

    errno = 0;
    float conv_ret_val = strtof(string, &endptr);

    bool out_of_range = (errno == ERANGE);
    bool failed =
        len == 0 || out_of_range || endptr == string || endptr == NULL;

    bool valid_endptr =
        *endptr == '\0' || (terminating_f && endptr == string + len - 1);
    bool result = !failed && valid_endptr;

    if (result) {
        *out = conv_ret_val;
    } else {
        *out = NAN;
    }

    return result;
}